

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestSpec::matches(TestSpec *this,TestCaseInfo *testCase)

{
  bool bVar1;
  const_iterator __lhs;
  Filter *in_RSI;
  TestCaseInfo *in_RDI;
  Filter *filter;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *__range1;
  reference in_stack_ffffffffffffffc8;
  __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
  local_28;
  
  local_28._M_current =
       (Filter *)
       clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::begin
                 ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
                  in_stack_ffffffffffffffc8);
  __lhs = clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::end
                    ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
                     in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) {
      return false;
    }
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
         ::operator*(&local_28);
    bVar1 = Filter::matches(in_RSI,in_RDI);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
    ::operator++(&local_28);
  }
  return true;
}

Assistant:

bool TestSpec::matches( TestCaseInfo const& testCase ) const {
        // A TestSpec matches if any filter matches
        for( auto const& filter : m_filters )
            if( filter.matches( testCase ) )
                return true;
        return false;
    }